

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O1

WebPMuxError WebPMuxSetChunk(WebPMux *mux,char *fourcc,WebPData *chunk_data,int copy_data)

{
  uint32_t tag;
  WebPMuxError WVar1;
  
  WVar1 = WEBP_MUX_INVALID_ARGUMENT;
  if (((chunk_data != (WebPData *)0x0 && (fourcc != (char *)0x0 && mux != (WebPMux *)0x0)) &&
      (chunk_data->bytes != (uint8_t *)0x0)) && (chunk_data->size < 0xfffffff7)) {
    tag = ChunkGetTagFromFourCC(fourcc);
    WVar1 = MuxDeleteAllNamedData(mux,tag);
    if ((uint)WVar1 < 2) {
      WVar1 = MuxSet(mux,tag,chunk_data,copy_data);
      return WVar1;
    }
  }
  return WVar1;
}

Assistant:

WebPMuxError WebPMuxSetChunk(WebPMux* mux, const char fourcc[4],
                             const WebPData* chunk_data, int copy_data) {
  uint32_t tag;
  WebPMuxError err;
  if (mux == NULL || fourcc == NULL || chunk_data == NULL ||
      chunk_data->bytes == NULL || chunk_data->size > MAX_CHUNK_PAYLOAD) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  tag = ChunkGetTagFromFourCC(fourcc);

  // Delete existing chunk(s) with the same 'fourcc'.
  err = MuxDeleteAllNamedData(mux, tag);
  if (err != WEBP_MUX_OK && err != WEBP_MUX_NOT_FOUND) return err;

  // Add the given chunk.
  return MuxSet(mux, tag, chunk_data, copy_data);
}